

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::setBackground(QMdiArea *this,QBrush *brush)

{
  long lVar1;
  QWidget *this_00;
  char cVar2;
  bool on;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  cVar2 = QBrush::operator==((QBrush *)(lVar1 + 0x3a8),brush);
  if (cVar2 != '\0') {
    return;
  }
  QBrush::operator=((QBrush *)(lVar1 + 0x3a8),brush);
  this_00 = *(QWidget **)(lVar1 + 0x2b0);
  on = (bool)QBrush::isOpaque();
  QWidget::setAttribute(this_00,WA_OpaquePaintEvent,on);
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
  return;
}

Assistant:

void QMdiArea::setBackground(const QBrush &brush)
{
    Q_D(QMdiArea);
    if (d->background != brush) {
        d->background = brush;
        d->viewport->setAttribute(Qt::WA_OpaquePaintEvent, brush.isOpaque());
        d->viewport->update();
    }
}